

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O0

void __thiscall GroupInfo::~GroupInfo(GroupInfo *this)

{
  GroupInfo *this_local;
  
  if ((this->name != (char *)0x0) && (this->name != (char *)0x0)) {
    operator_delete__(this->name);
  }
  if ((this->description != (char *)0x0) && (this->description != (char *)0x0)) {
    operator_delete__(this->description);
  }
  return;
}

Assistant:

~GroupInfo() {
		if (name)
			delete[] name;
		if (description)
			delete[] description;
	}